

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subprocess.h
# Opt level: O0

pair<int,_int> subprocess::util::pipe_cloexec(void)

{
  int iVar1;
  string *err_msg;
  pair<int,_int> pVar2;
  long in_FS_OFFSET;
  int res;
  int pipe_fds [2];
  undefined4 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  int *in_stack_ffffffffffffff80;
  undefined8 in_stack_ffffffffffffff98;
  int err_code;
  OSError *this;
  allocator<char> *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  int local_10 [2];
  long local_8;
  
  err_code = (int)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = pipe(local_10);
  if (iVar1 == 0) {
    set_clo_on_exec(in_stack_ffffffffffffff7c,SUB41((uint)in_stack_ffffffffffffff78 >> 0x18,0));
    set_clo_on_exec(in_stack_ffffffffffffff7c,SUB41((uint)in_stack_ffffffffffffff78 >> 0x18,0));
    pVar2 = std::make_pair<int&,int&>
                      (in_stack_ffffffffffffff80,
                       (int *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      return pVar2;
    }
  }
  else {
    err_msg = (string *)__cxa_allocate_exception(0x10);
    this = (OSError *)&stack0xffffffffffffffcf;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
               (char *)CONCAT44(in_stack_ffffffffffffffc4,iVar1),in_stack_ffffffffffffffb8);
    __errno_location();
    OSError::OSError(this,err_msg,err_code);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      __cxa_throw(err_msg,&OSError::typeinfo,OSError::~OSError);
    }
  }
  __stack_chk_fail();
}

Assistant:

static inline
  std::pair<int, int> pipe_cloexec() noexcept(false)
  {
    int pipe_fds[2];
    int res = pipe(pipe_fds);
    if (res) {
      throw OSError("pipe failure", errno);
    }

    set_clo_on_exec(pipe_fds[0]);
    set_clo_on_exec(pipe_fds[1]);

    return std::make_pair(pipe_fds[0], pipe_fds[1]);
  }